

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::resize_internal
          (QList<QStyleOptionViewItem::ViewItemPosition> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QStyleOptionViewItem::ViewItemPosition> *this_00;
  __off_t __length;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RSI;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RDI;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *this_01;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *__file;
  
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::needsDetach
                    (in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *)
         capacity((QList<QStyleOptionViewItem::ViewItemPosition> *)0x907b81);
    qVar2 = QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::freeSpaceAtBegin
                      (in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QStyleOptionViewItem::ViewItemPosition> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QStyleOptionViewItem::ViewItemPosition> *)
                QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QStyleOptionViewItem::ViewItemPosition>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (ViewItemPosition **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}